

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo
          (cmComputeLinkInformation *this,string *fullPath,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string soName;
  allocator<char> local_51;
  string local_50;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_51);
  bVar1 = cmMakefile::IsOn(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if ((bVar1) &&
     (bVar1 = cmGeneratorTarget::HasMacOSXRpathInstallNameDir(target,&this->Config), !bVar1)) {
    return;
  }
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == UNKNOWN_LIBRARY) {
    AddLibraryRuntimeInfo(this,fullPath);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(target);
    if (TVar2 == SHARED_LIBRARY) {
      bVar1 = cmGeneratorTarget::HasKnownRuntimeArtifactLocation(target,&this->Config);
      if (bVar1) {
        cmGeneratorTarget::GetSOName(&local_50,target,&this->Config,RuntimeBinaryArtifact);
        if ((char *)local_50._M_string_length != (char *)0x0) {
          local_50._M_string_length = (size_type)local_50._M_dataplus._M_p;
        }
        cmOrderDirectories::AddRuntimeLibrary
                  ((this->OrderRuntimeSearchPath)._M_t.
                   super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                   .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,
                   (char *)local_50._M_string_length);
        if (this->LinkWithRuntimePath == true) {
          cmOrderDirectories::AddRuntimeLibrary
                    ((this->OrderLinkerSearchPath)._M_t.
                     super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                     .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,
                     (char *)local_50._M_string_length);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath, cmGeneratorTarget const* target)
{
  // Ignore targets on Apple where install_name is not @rpath.
  // The dependenty library can be found with other means such as
  // @loader_path or full paths.
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    if (!target->HasMacOSXRpathInstallNameDir(this->Config)) {
      return;
    }
  }

  // Libraries with unknown type must be handled using just the file
  // on disk.
  if (target->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
    this->AddLibraryRuntimeInfo(fullPath);
    return;
  }

  // Skip targets that are not shared libraries (modules cannot be linked).
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
    return;
  }

  // Skip targets that do not have a known runtime artifact.
  if (!target->HasKnownRuntimeArtifactLocation(this->Config)) {
    return;
  }

  // Try to get the soname of the library.  Only files with this name
  // could possibly conflict.
  std::string soName = target->GetSOName(this->Config);
  const char* soname = soName.empty() ? nullptr : soName.c_str();

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath, soname);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath, soname);
  }
}